

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BasicReporter::ReportCounts(BasicReporter *this,Totals *totals,string *allPrefix)

{
  size_t sVar1;
  pointer pcVar2;
  ostream *poVar3;
  Colour *this_00;
  Colour colour_1;
  allocator local_b2;
  allocator local_b1;
  undefined1 local_b0 [40];
  allocator local_88 [32];
  string local_68 [32];
  Colour colour;
  string local_40 [32];
  
  sVar1 = (totals->assertions).failed;
  if ((totals->assertions).passed + sVar1 == 0) {
    std::operator<<((this->m_config).m_stream,"No tests ran");
    return;
  }
  if (sVar1 == 0) {
    Colour::Colour(&colour_1,BrightGreen);
    poVar3 = std::operator<<((this->m_config).m_stream,(string *)allPrefix);
    poVar3 = std::operator<<(poVar3,"tests passed (");
    pcVar2 = (pointer)(totals->assertions).passed;
    std::__cxx11::string::string((string *)local_88,"assertion",&local_b1);
    local_b0._0_8_ = pcVar2;
    std::__cxx11::string::string((string *)(local_b0 + 8),(string *)local_88);
    poVar3 = operator<<(poVar3,(pluralise *)local_b0);
    poVar3 = std::operator<<(poVar3," in ");
    sVar1 = (totals->testCases).passed;
    std::__cxx11::string::string(local_68,"test case",&local_b2);
    _colour = sVar1;
    std::__cxx11::string::string(local_40,local_68);
    poVar3 = operator<<(poVar3,(pluralise *)&colour);
    std::operator<<(poVar3,")");
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string((string *)(local_b0 + 8));
    std::__cxx11::string::~string((string *)local_88);
    this_00 = &colour_1;
  }
  else {
    Colour::Colour(&colour,BrightRed);
    std::__cxx11::string::string((string *)local_b0,"test case",local_88);
    ReportCounts(this,(string *)local_b0,&totals->testCases,allPrefix);
    std::__cxx11::string::~string((string *)local_b0);
    if ((totals->testCases).failed != 0) {
      std::operator<<((this->m_config).m_stream," (");
      std::__cxx11::string::string((string *)local_b0,"assertion",local_88);
      ReportCounts(this,(string *)local_b0,&totals->assertions,allPrefix);
      std::__cxx11::string::~string((string *)local_b0);
      std::operator<<((this->m_config).m_stream,")");
    }
    this_00 = &colour;
  }
  Colour::~Colour(this_00);
  return;
}

Assistant:

void ReportCounts( const Totals& totals, const std::string& allPrefix = "All " ) {
            if( totals.assertions.total() == 0 ) {
                m_config.stream() << "No tests ran";
            }
            else if( totals.assertions.failed ) {
                Colour colour( Colour::ResultError );
                ReportCounts( "test case", totals.testCases, allPrefix );
                if( totals.testCases.failed > 0 ) {
                    m_config.stream() << " (";
                    ReportCounts( "assertion", totals.assertions, allPrefix );
                    m_config.stream() << ")";
                }
            }
            else {
                Colour colour( Colour::ResultSuccess );
                m_config.stream()   << allPrefix << "tests passed ("
                                    << pluralise( totals.assertions.passed, "assertion" ) << " in "
                                    << pluralise( totals.testCases.passed, "test case" ) << ")";
            }
        }